

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

StructType * LLVMBC::dyn_cast<LLVMBC::StructType>(Type *type)

{
  TypeID TVar1;
  StructType *pSVar2;
  
  if (type != (Type *)0x0) {
    TVar1 = Type::getTypeID(type);
    pSVar2 = (StructType *)0x0;
    if (TVar1 == StructTyID) {
      pSVar2 = (StructType *)type;
    }
    return pSVar2;
  }
  return (StructType *)0x0;
}

Assistant:

inline T *dyn_cast(Type *type)
{
	if (!type)
		return nullptr;

	if (type->getTypeID() != T::get_type_id())
		return nullptr;
	else
		return static_cast<T *>(type);
}